

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int spiXfer(uint handle,char *txBuf,char *rxBuf,uint count)

{
  char *pcVar1;
  uint in_ECX;
  uint in_EDI;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  FILE *pFVar2;
  undefined8 in_stack_ffffffffffffffb0;
  uint local_4;
  
  pFVar2 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar1 = myTimeStamp();
    in_stack_ffffffffffffff98 = myBuf2Str(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
    fprintf(pFVar2,"%s %s: handle=%d count=%d [%s]\n",pcVar1,"spiXfer",(ulong)in_EDI,(ulong)in_ECX);
  }
  pFVar2 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar1 = myTimeStamp();
      fprintf(pFVar2,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar1,"spiXfer");
    }
    local_4 = 0xffffffe1;
  }
  else if (in_EDI < 0x20) {
    if (spiInfo[in_EDI].state == 2) {
      if (in_ECX < 0x10001) {
        spiGo((uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(uint32_t)in_stack_ffffffffffffffb0,
              in_stack_ffffffffffffffa8,
              (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        local_4 = in_ECX;
      }
      else {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar1 = myTimeStamp();
          fprintf(pFVar2,"%s %s: bad count (%d)\n",pcVar1,"spiXfer",(ulong)in_ECX);
        }
        local_4 = 0xffffffac;
      }
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar1 = myTimeStamp();
        fprintf(pFVar2,"%s %s: bad handle (%d)\n",pcVar1,"spiXfer",(ulong)in_EDI);
      }
      local_4 = 0xffffffe7;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar1 = myTimeStamp();
      fprintf(pFVar2,"%s %s: bad handle (%d)\n",pcVar1,"spiXfer",(ulong)in_EDI);
    }
    local_4 = 0xffffffe7;
  }
  return local_4;
}

Assistant:

int spiXfer(unsigned handle, char *txBuf, char *rxBuf, unsigned count)
{
   DBG(DBG_USER, "handle=%d count=%d [%s]",
      handle, count, myBuf2Str(count, txBuf));

   CHECK_INITED;

   if (handle >= PI_SPI_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (spiInfo[handle].state != PI_SPI_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (count > PI_MAX_SPI_DEVICE_COUNT)
      SOFT_ERROR(PI_BAD_SPI_COUNT, "bad count (%d)", count);

   spiGo(spiInfo[handle].speed, spiInfo[handle].flags, txBuf, rxBuf, count);

   return count;
}